

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeTBLInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  uint uVar2;
  ushort *puVar3;
  uint uVar4;
  uint Register;
  
  uVar1 = DPRDecoderTable[Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf];
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  if ((Insn & 0x40) != 0) {
    MCOperand_CreateReg0(Inst,(uint)uVar1);
  }
  uVar4 = Insn >> 0x10 & 0xf | Insn >> 3 & 0x10;
  uVar2 = MCInst_getOpcode(Inst);
  if ((uVar2 == 0x8b0) || (uVar2 == 0x8aa)) {
    if (uVar4 == 0x1f) {
      return MCDisassembler_Fail;
    }
    puVar3 = DPairDecoderTable + uVar4;
  }
  else {
    puVar3 = DPRDecoderTable + uVar4;
  }
  MCOperand_CreateReg0(Inst,(uint)*puVar3);
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[Insn >> 1 & 0x10 | Insn & 0xf]);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeTBLInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, op;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 7, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	op = fieldFromInstruction_4(Insn, 6, 1);

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (op) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail; // Writeback
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VTBL2:
		case ARM_VTBX2:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}